

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc
          (Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *this)

{
  WebSocketPipeImpl *pWVar1;
  Disposer *pDVar2;
  
  pWVar1 = (this->own).ptr;
  if (pWVar1 != (WebSocketPipeImpl *)0x0) {
    (this->own).ptr = (WebSocketPipeImpl *)0x0;
    pDVar2 = (this->own).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pWVar1->super_WebSocket)._vptr_WebSocket[-2] +
                      (long)&(pWVar1->super_WebSocket)._vptr_WebSocket);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }